

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall
CMU462::DynamicScene::XFormWidget::setSelection(XFormWidget *this,int pickID,Selection *selection)

{
  mapped_type mVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  int local_1c;
  
  local_1c = pickID;
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>,_std::_Select1st<std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>_>_>
          ::find(&(this->pickIDToAxis)._M_t,&local_1c);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header)
  {
    (this->target).axis = None;
  }
  else {
    (selection->coordinates).x = 0.0;
    (selection->coordinates).y = 0.0;
    (selection->coordinates).z = 0.0;
    selection->axis = None;
    selection->object = &this->super_SceneObject;
    selection->element = (HalfedgeElement *)0x0;
    pmVar3 = std::
             map<int,_CMU462::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>_>_>
             ::operator[](&this->pickIDToAxis,&local_1c);
    mVar1 = *pmVar3;
    (this->target).axis = mVar1;
    selection->axis = mVar1;
  }
  return;
}

Assistant:

void XFormWidget::setSelection( int pickID, Selection& selection )
{
   if( pickIDToAxis.find(pickID) != pickIDToAxis.end() )
   {
      selection.clear();
      selection.object = this;
      selection.element = nullptr;
      selection.axis = target.axis = pickIDToAxis[pickID];
   }
   else
   {
      target.axis = Selection::Axis::None;
   }
}